

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

int __thiscall
cmCTestCoverageHandler::HandleCoberturaCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  cmCTest *pcVar1;
  size_t sVar2;
  bool bVar3;
  ostream *poVar4;
  string coverageXMLFile;
  char *local_200 [4];
  cmParseCoberturaCoverage cov;
  ostringstream cmCTestLog_msg;
  
  cmParseCoberturaCoverage::cmParseCoberturaCoverage
            (&cov,cont,(this->super_cmCTestGenericHandler).CTest);
  coverageXMLFile._M_dataplus._M_p = (pointer)&coverageXMLFile.field_2;
  coverageXMLFile._M_string_length = 0;
  coverageXMLFile.field_2._M_local_buf[0] = '\0';
  bVar3 = cmsys::SystemTools::GetEnv("COBERTURADIR",&coverageXMLFile);
  if (!bVar3 || coverageXMLFile._M_string_length == 0) {
    cmCTest::GetBinaryDir_abi_cxx11_
              ((string *)&cmCTestLog_msg,(this->super_cmCTestGenericHandler).CTest);
    std::__cxx11::string::operator=((string *)&coverageXMLFile,(string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  std::__cxx11::string::append((char *)&coverageXMLFile);
  bVar3 = cmsys::SystemTools::FileExists(&coverageXMLFile);
  if (bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"Parsing Cobertura XML file: ");
    poVar4 = std::operator<<(poVar4,(string *)&coverageXMLFile);
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x297,local_200[0],(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)local_200);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    cmParseCoberturaCoverage::ReadCoverageXML(&cov,coverageXMLFile._M_dataplus._M_p);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCTestLog_msg," Cannot find Cobertura XML file: ");
    poVar4 = std::operator<<(poVar4,(string *)&coverageXMLFile);
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x29d,local_200[0],(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)local_200);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  sVar2 = (cont->TotalCoverage)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::__cxx11::string::~string((string *)&coverageXMLFile);
  cmParseCoberturaCoverage::~cmParseCoberturaCoverage(&cov);
  return (int)sVar2;
}

Assistant:

int cmCTestCoverageHandler::HandleCoberturaCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  cmParseCoberturaCoverage cov(*cont, this->CTest);

  // Assume the coverage.xml is in the binary directory
  // check for the COBERTURADIR environment variable,
  // if it doesn't exist or is empty, assume the
  // binary directory is used.
  std::string coverageXMLFile;
  if (!cmSystemTools::GetEnv("COBERTURADIR", coverageXMLFile) ||
      coverageXMLFile.empty()) {
    coverageXMLFile = this->CTest->GetBinaryDir();
  }
  // build the find file string with the directory from above
  coverageXMLFile += "/coverage.xml";

  if (cmSystemTools::FileExists(coverageXMLFile)) {
    // If file exists, parse it
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Parsing Cobertura XML file: " << coverageXMLFile
                                                      << std::endl,
                       this->Quiet);
    cov.ReadCoverageXML(coverageXMLFile.c_str());
  } else {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Cannot find Cobertura XML file: " << coverageXMLFile
                                                           << std::endl,
                       this->Quiet);
  }
  return static_cast<int>(cont->TotalCoverage.size());
}